

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O0

string * __thiscall
OpenMPInReductionClause::toString_abi_cxx11_
          (string *__return_storage_ptr__,OpenMPInReductionClause *this)

{
  ulong uVar1;
  string local_98;
  string local_78;
  OpenMPInReductionClauseIdentifier local_58;
  allocator<char> local_51;
  OpenMPInReductionClauseIdentifier identifier;
  string clause_string;
  allocator<char> local_1a;
  byte local_19;
  OpenMPInReductionClause *local_18;
  OpenMPInReductionClause *this_local;
  string *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (OpenMPInReductionClause *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"in_reduction ",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&identifier,"(",&local_51);
  std::allocator<char>::~allocator(&local_51);
  local_58 = getIdentifier(this);
  switch(local_58) {
  case OMPC_IN_REDUCTION_IDENTIFIER_plus:
    std::__cxx11::string::operator+=((string *)&identifier,"+");
    break;
  case OMPC_IN_REDUCTION_IDENTIFIER_minus:
    std::__cxx11::string::operator+=((string *)&identifier,"-");
    break;
  case OMPC_IN_REDUCTION_IDENTIFIER_mul:
    std::__cxx11::string::operator+=((string *)&identifier,"*");
    break;
  case OMPC_IN_REDUCTION_IDENTIFIER_bitand:
    std::__cxx11::string::operator+=((string *)&identifier,"&");
    break;
  case OMPC_IN_REDUCTION_IDENTIFIER_bitor:
    std::__cxx11::string::operator+=((string *)&identifier,"|");
    break;
  case OMPC_IN_REDUCTION_IDENTIFIER_bitxor:
    std::__cxx11::string::operator+=((string *)&identifier,"^");
    break;
  case OMPC_IN_REDUCTION_IDENTIFIER_logand:
    std::__cxx11::string::operator+=((string *)&identifier,"&&");
    break;
  case OMPC_IN_REDUCTION_IDENTIFIER_logor:
    std::__cxx11::string::operator+=((string *)&identifier,"||");
    break;
  default:
    break;
  case OMPC_IN_REDUCTION_IDENTIFIER_max:
    std::__cxx11::string::operator+=((string *)&identifier,"max");
    break;
  case OMPC_IN_REDUCTION_IDENTIFIER_min:
    std::__cxx11::string::operator+=((string *)&identifier,"min");
    break;
  case OMPC_IN_REDUCTION_IDENTIFIER_user:
    getUserDefinedIdentifier_abi_cxx11_(&local_78,this);
    std::__cxx11::string::operator+=((string *)&identifier,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  uVar1 = std::__cxx11::string::size();
  if (1 < uVar1) {
    std::__cxx11::string::operator+=((string *)&identifier," : ");
  }
  OpenMPClause::expressionToString_abi_cxx11_(&local_98,&this->super_OpenMPClause);
  std::__cxx11::string::operator+=((string *)&identifier,(string *)&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::operator+=((string *)&identifier,") ");
  uVar1 = std::__cxx11::string::size();
  if (3 < uVar1) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&identifier);
  }
  local_19 = 1;
  std::__cxx11::string::~string((string *)&identifier);
  if ((local_19 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPInReductionClause::toString() {

    std::string result = "in_reduction ";
    std::string clause_string = "(";
    OpenMPInReductionClauseIdentifier identifier = this->getIdentifier();
    switch (identifier) {
        case OMPC_IN_REDUCTION_IDENTIFIER_plus:
            clause_string += "+";
            break;
        case OMPC_IN_REDUCTION_IDENTIFIER_minus:
            clause_string += "-";
            break;
        case OMPC_IN_REDUCTION_IDENTIFIER_mul:
            clause_string += "*";
            break;
        case OMPC_IN_REDUCTION_IDENTIFIER_bitand:
            clause_string += "&";
            break;
        case OMPC_IN_REDUCTION_IDENTIFIER_bitor:
            clause_string += "|";
            break;
        case OMPC_IN_REDUCTION_IDENTIFIER_bitxor:
            clause_string += "^";
            break;
        case OMPC_IN_REDUCTION_IDENTIFIER_logand:
            clause_string += "&&";
            break;
        case OMPC_IN_REDUCTION_IDENTIFIER_logor:
            clause_string += "||";
            break;
        case OMPC_IN_REDUCTION_IDENTIFIER_min:
            clause_string += "min";
            break;
        case OMPC_IN_REDUCTION_IDENTIFIER_max:
            clause_string += "max";
            break;
        case OMPC_IN_REDUCTION_IDENTIFIER_user:
            clause_string += this->getUserDefinedIdentifier();
            break;
        default:
            ;
    }
    if (clause_string.size() > 1) {
        clause_string += " : ";
    };
    clause_string += this->expressionToString();
    clause_string += ") ";
    if (clause_string.size() > 3) {
        result += clause_string;
    };

    return result;
}